

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void __thiscall
duckdb::ModeFunction<duckdb::ModeString>::
Finalize<duckdb::string_t,duckdb::ModeState<duckdb::string_t,duckdb::ModeString>>
          (ModeFunction<duckdb::ModeString> *this,
          ModeState<duckdb::string_t,_duckdb::ModeString> *state,string_t *target,
          AggregateFinalizeData *finalize_data)

{
  const_iterator cVar1;
  string_t sVar2;
  
  if (*(long *)(this + 0x18) != 0) {
    cVar1 = ModeState<duckdb::string_t,_duckdb::ModeString>::Scan
                      ((ModeState<duckdb::string_t,_duckdb::ModeString> *)this);
    if (cVar1.super__Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>.
        _M_cur != (__node_type *)0x0) {
      sVar2.value.pointer.ptr = (char *)finalize_data;
      sVar2.value._0_8_ =
           *(undefined8 *)
            ((long)cVar1.
                   super__Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>
                   ._M_cur + 0x10);
      sVar2 = StringVector::AddStringOrBlob
                        (*(StringVector **)&target->value,
                         *(Vector **)
                          ((long)cVar1.
                                 super__Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>
                                 ._M_cur + 8),sVar2);
      *(anon_union_16_2_67f50693_for_value *)
       &(state->prevs).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
        super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
        super__Vector_impl_data = sVar2.value;
      return;
    }
  }
  AggregateFinalizeData::ReturnNull((AggregateFinalizeData *)target);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (!state.frequency_map) {
			finalize_data.ReturnNull();
			return;
		}
		auto highest_frequency = state.Scan();
		if (highest_frequency != state.frequency_map->end()) {
			target = TYPE_OP::template Assign<T, T>(finalize_data.result, highest_frequency->first);
		} else {
			finalize_data.ReturnNull();
		}
	}